

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O2

void __thiscall
SmallVector_AppendIteratorRange_Test::TestBody(SmallVector_AppendIteratorRange_Test *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *message;
  AssertHelper local_d0;
  AssertionResult gtest_ar;
  int local_b4 [7];
  array<int,_4UL> extra;
  _Tuple_impl<6UL,_int,_int> local_88 [5];
  small_vector<int,_4UL> a;
  tuple<int,_int,_int,_int,_int,_int,_int,_int> local_28;
  
  a.buffer_ = a.small_buffer_._M_elems;
  a.elements_ = 4;
  a.small_buffer_._M_elems[0] = 0;
  a.small_buffer_._M_elems[1] = 0;
  a.small_buffer_._M_elems[2] = 0;
  a.small_buffer_._M_elems[3] = 0;
  a.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  a.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  a.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lVar3 = 0;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -4) {
    a.small_buffer_._M_elems[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  }
  iVar1 = 100;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    *(int *)((long)extra._M_elems + lVar2) = iVar1;
    iVar1 = iVar1 + 1;
  }
  pstore::small_vector<int,4ul>::append<int*>
            ((small_vector<int,4ul> *)&a,extra._M_elems,(int *)local_88);
  local_d0.data_._0_4_ = 0;
  local_b4[6] = 1;
  local_b4[5] = 2;
  local_b4[4] = 3;
  local_b4[3] = 100;
  local_b4[2] = 0x65;
  local_b4[1] = 0x66;
  local_b4[0] = 0x67;
  std::tuple<int,_int,_int,_int,_int,_int,_int,_int>::tuple<true,_true>
            (&local_28,(int *)&local_d0,local_b4 + 6,local_b4 + 5,local_b4 + 4,local_b4 + 3,
             local_b4 + 2,local_b4 + 1,local_b4);
  local_88[2].super__Tuple_impl<7UL,_int>.super__Head_base<7UL,_int,_false>._M_head_impl =
       (_Head_base<7UL,_int,_false>)
       (_Head_base<7UL,_int,_false>)
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>.
       _M_head_impl;
  local_88[2].super__Head_base<6UL,_int,_false>._M_head_impl =
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.super__Head_base<2UL,_int,_false>.
       _M_head_impl;
  local_88[3].super__Tuple_impl<7UL,_int>.super__Head_base<7UL,_int,_false>._M_head_impl =
       (_Head_base<7UL,_int,_false>)
       (_Head_base<7UL,_int,_false>)
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
       _M_head_impl;
  local_88[3].super__Head_base<6UL,_int,_false>._M_head_impl =
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Head_base<0UL,_int,_false>._M_head_impl;
  local_88[0] = local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
                super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
                super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.
                super__Tuple_impl<4UL,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int>.
                super__Tuple_impl<6UL,_int,_int>;
  local_88[1].super__Tuple_impl<7UL,_int>.super__Head_base<7UL,_int,_false>._M_head_impl =
       (_Head_base<7UL,_int,_false>)
       (_Head_base<7UL,_int,_false>)
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
       super__Tuple_impl<5UL,_int,_int,_int>.super__Head_base<5UL,_int,_false>._M_head_impl;
  local_88[1].super__Head_base<6UL,_int,_false>._M_head_impl =
       local_28.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
       super__Head_base<4UL,_int,_false>._M_head_impl;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int,int,int>>>
  ::operator()(&gtest_ar,(char *)local_88,(small_vector<int,_4UL> *)0x1c7d83);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x130,message);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_88[0] != (_Tuple_impl<6UL,_int,_int>)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&a.big_buffer_.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST (SmallVector, SizeAfterResizeLarger) {
    pstore::small_vector<int, 4> b (std::size_t{4});
    std::size_t const size{10};
    b.resize (size);
    EXPECT_EQ (size, b.size ());
    EXPECT_GE (size, b.capacity ())
        << "expected capacity to be at least " << size << " (the container size)";
}